

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void blogc_mkdir_recursive(char *filename)

{
  char cVar1;
  int iVar2;
  char *__path;
  uint *puVar3;
  ulong uVar4;
  char *pcVar5;
  
  __path = bc_strdup(filename);
  pcVar5 = __path;
  do {
    cVar1 = *pcVar5;
    if ((cVar1 == '/') || (cVar1 == '\\')) {
      *pcVar5 = '\0';
      if (*__path != '\0') {
        iVar2 = mkdir(__path,0x1ff);
        if (iVar2 == -1) {
          puVar3 = (uint *)__errno_location();
          uVar4 = (ulong)*puVar3;
          if (*puVar3 != 0x11) {
            blogc_mkdir_recursive_cold_1();
            if (uVar4 == 0) {
              return;
            }
            blogc_debug_template_cold_1();
            return;
          }
        }
      }
      *pcVar5 = cVar1;
    }
    else if (cVar1 == '\0') {
      free(__path);
      return;
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static void
blogc_mkdir_recursive(const char *filename)
{
    char *fname = bc_strdup(filename);
    for (char *tmp = fname; *tmp != '\0'; tmp++) {
        if (*tmp != '/' && *tmp != '\\')
            continue;
#ifdef HAVE_SYS_STAT_H
        char bkp = *tmp;
        *tmp = '\0';
        if ((strlen(fname) > 0) &&
#if defined(WIN32) || defined(_WIN32)
            (-1 == mkdir(fname)) &&
#else
            (-1 == mkdir(fname, 0777)) &&
#endif
            (errno != EEXIST))
        {
            fprintf(stderr, "blogc: error: failed to create output "
                "directory (%s): %s\n", fname, strerror(errno));
            free(fname);
            exit(2);
        }
        *tmp = bkp;
#else
        // FIXME: show this warning only if actually trying to create a directory.
        fprintf(stderr, "blogc: warning: can't create output directories "
            "for your platform. please create the directories yourself.\n");
        break;
#endif
    }
    free(fname);
}